

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absOldRef.c
# Opt level: O0

int Gia_ManCexAbstractionRefine
              (Gia_Man_t *pGia,Abc_Cex_t *pCex,int nFfToAddMax,int fTryFour,int fSensePath,
              int fVerbose)

{
  int iVar1;
  Aig_Man_t *p;
  Vec_Int_t *vFlops_00;
  Vec_Int_t *pVVar2;
  Vec_Int_t *vFlops;
  Aig_Man_t *pNew;
  int fVerbose_local;
  int fSensePath_local;
  int fTryFour_local;
  int nFfToAddMax_local;
  Abc_Cex_t *pCex_local;
  Gia_Man_t *pGia_local;
  
  if (pGia->vFlopClasses == (Vec_Int_t *)0x0) {
    printf("Gia_ManCexAbstractionRefine(): Abstraction latch map is missing.\n");
    pGia_local._4_4_ = -1;
  }
  else {
    p = Gia_ManToAig(pGia,0);
    vFlops_00 = Gia_ManClasses2Flops(pGia->vFlopClasses);
    iVar1 = Saig_ManCexRefineStep
                      (p,vFlops_00,pGia->vFlopClasses,pCex,nFfToAddMax,fTryFour,fSensePath,fVerbose)
    ;
    if (iVar1 == 0) {
      pGia->pCexSeq = p->pSeqModel;
      p->pSeqModel = (Abc_Cex_t *)0x0;
      Vec_IntFree(vFlops_00);
      Aig_ManStop(p);
      pGia_local._4_4_ = 0;
    }
    else {
      Vec_IntFree(pGia->vFlopClasses);
      pVVar2 = Gia_ManFlops2Classes(pGia,vFlops_00);
      pGia->vFlopClasses = pVVar2;
      Vec_IntFree(vFlops_00);
      Aig_ManStop(p);
      pGia_local._4_4_ = -1;
    }
  }
  return pGia_local._4_4_;
}

Assistant:

int Gia_ManCexAbstractionRefine( Gia_Man_t * pGia, Abc_Cex_t * pCex, int nFfToAddMax, int fTryFour, int fSensePath, int fVerbose )
{
    Aig_Man_t * pNew;
    Vec_Int_t * vFlops;
    if ( pGia->vFlopClasses == NULL )
    {
        printf( "Gia_ManCexAbstractionRefine(): Abstraction latch map is missing.\n" );
        return -1;
    }
    pNew = Gia_ManToAig( pGia, 0 );
    vFlops = Gia_ManClasses2Flops( pGia->vFlopClasses );
    if ( !Saig_ManCexRefineStep( pNew, vFlops, pGia->vFlopClasses, pCex, nFfToAddMax, fTryFour, fSensePath, fVerbose ) )
    {
        pGia->pCexSeq = pNew->pSeqModel; pNew->pSeqModel = NULL;
        Vec_IntFree( vFlops );
        Aig_ManStop( pNew );
        return 0;
    }
    Vec_IntFree( pGia->vFlopClasses );
    pGia->vFlopClasses = Gia_ManFlops2Classes( pGia, vFlops );
    Vec_IntFree( vFlops );
    Aig_ManStop( pNew );
    return -1;
}